

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<Person,_std::shared_ptr<Person>_> * __thiscall
pybind11::class_<Person,std::shared_ptr<Person>>::
def_property<std::shared_ptr<Job>(Person::*)()const>
          (class_<Person,std::shared_ptr<Person>> *this,char *name,offset_in_Job_to_subr *fget,
          cpp_function *fset)

{
  class_<Person,_std::shared_ptr<Person>_> *pcVar1;
  return_value_policy local_29;
  cpp_function local_28;
  
  cpp_function::cpp_function<std::shared_ptr<Job>,Person>(&local_28,*fget);
  local_29 = reference_internal;
  pcVar1 = class_<Person,_std::shared_ptr<Person>_>::def_property<pybind11::return_value_policy>
                     ((class_<Person,_std::shared_ptr<Person>_> *)this,name,&local_28,fset,&local_29
                     );
  object::~object((object *)&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(fget), fset, return_value_policy::reference_internal, extra...);
    }